

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oop_interface.cpp
# Opt level: O3

void __thiscall
isotree::IsolationForest::fit
          (IsolationForest *this,double *numeric_data,size_t ncols_numeric,size_t nrows,
          int *categ_data,size_t ncols_categ,int *ncat,double *sample_weights,double *col_weights)

{
  Imputer *model_outputs;
  int iVar1;
  Imputer *imputer;
  runtime_error *this_00;
  Imputer *model_outputs_ext;
  Imputer *pIVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  check_params(this);
  override_previous_fit(this);
  model_outputs_ext = (Imputer *)&this->model_ext;
  pIVar2 = (Imputer *)0x0;
  model_outputs = pIVar2;
  if (this->ndim == 1) {
    model_outputs_ext = pIVar2;
    model_outputs = (Imputer *)&this->model;
  }
  imputer = &this->imputer;
  if (this->build_imputer == false) {
    imputer = pIVar2;
  }
  iVar1 = fit_iforest((IsoForest *)model_outputs,(ExtIsoForest *)model_outputs_ext,numeric_data,
                      ncols_numeric,categ_data,ncols_categ,ncat,(double *)0x0,(int *)0x0,(int *)0x0,
                      this->ndim,this->ntry,this->coef_type,this->coef_by_prop,sample_weights,
                      this->with_replacement,this->weight_as_sample,nrows,this->sample_size,
                      this->ntrees,this->max_depth,this->ncols_per_tree,this->limit_depth,
                      this->penalize_range,this->standardize_data,this->scoring_metric,
                      this->fast_bratio,false,(double *)0x0,(double *)0x0,true,col_weights,
                      this->weigh_by_kurt,this->prob_pick_by_gain_pl,this->prob_pick_by_gain_avg,
                      this->prob_pick_by_full_gain,this->prob_pick_by_dens,
                      this->prob_pick_col_by_range,this->prob_pick_col_by_var,
                      this->prob_pick_col_by_kurt,this->min_gain,this->missing_action,
                      this->cat_split_type,this->new_cat_action,this->all_perm,imputer,
                      this->min_imp_obs,this->depth_imp,this->weigh_imp_rows,false,this->random_seed
                      ,false,this->nthreads);
  if (iVar1 == 0) {
    this->is_fitted = true;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"Unexpected error in ","");
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f0,
             "/workspace/llm4binary/github/license_c_cmakelists/david-cortes[P]isotree/src/oop_interface.cpp"
             ,"");
  std::operator+(&local_b0,&local_150,&local_f0);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,":","");
  std::operator+(&local_90,&local_b0,&local_110);
  std::__cxx11::to_string(&local_d0,0xc4);
  std::operator+(&local_70,&local_90,&local_d0);
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_130,
             ". Please open an issue in GitHub with this information, indicating the installed version of \'isotree\'.\n"
             ,"");
  std::operator+(&local_50,&local_70,&local_130);
  std::runtime_error::runtime_error(this_00,(string *)&local_50);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void IsolationForest::fit(double numeric_data[],   size_t ncols_numeric,  size_t nrows,
                          int    categ_data[],     size_t ncols_categ,    int ncat[],
                          double sample_weights[], double col_weights[])
{
    this->check_params();
    this->override_previous_fit();

    auto retcode = fit_iforest(
        (this->ndim == 1)? &this->model : nullptr,
        (this->ndim != 1)? &this->model_ext : nullptr,
        numeric_data,  ncols_numeric,
        categ_data, ncols_categ, ncat,
        (double*)nullptr, (int*)nullptr, (int*)nullptr,
        this->ndim, this->ntry, this->coef_type, this->coef_by_prop,
        sample_weights, this->with_replacement, this->weight_as_sample,
        nrows, this->sample_size, this->ntrees,
        this->max_depth, this->ncols_per_tree,
        this->limit_depth, this->penalize_range, this->standardize_data,
        this->scoring_metric, this->fast_bratio,
        false, (double*)nullptr,
        (double*)nullptr, true,
        col_weights, this->weigh_by_kurt,
        this->prob_pick_by_gain_pl,
        this->prob_pick_by_gain_avg,
        this->prob_pick_by_full_gain,
        this->prob_pick_by_dens,
        this->prob_pick_col_by_range,
        this->prob_pick_col_by_var,
        this->prob_pick_col_by_kurt,
        this->min_gain, this->missing_action,
        this->cat_split_type, this->new_cat_action,
        this->all_perm, this->build_imputer? &this->imputer : nullptr, this->min_imp_obs,
        this->depth_imp, this->weigh_imp_rows, false,
        this->random_seed, false, this->nthreads
    );
    if (retcode != EXIT_SUCCESS) unexpected_error();
    this->is_fitted = true;
}